

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O3

bool __thiscall crnlib::crn_comp::alias_images(crn_comp *this)

{
  color_quad<unsigned_char,_int> *pcVar1;
  color_quad<unsigned_char,_int> *p;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  conversion_type conv_type;
  crn_comp_params *pcVar5;
  ulong uVar6;
  pixel_buf_t *ppVar7;
  pixel_buf_t *ppVar8;
  long lVar9;
  level_details *plVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  image<crnlib::color_quad<unsigned_char,_int>_> *other;
  image<crnlib::color_quad<unsigned_char,_int>_> *local_80;
  image<crnlib::color_quad<unsigned_char,_int>_> local_68;
  
  pcVar5 = this->m_pParams;
  if (pcVar5->m_faces != 0) {
    ppVar7 = &this->m_images[0][0].m_pixel_buf;
    local_80 = (image<crnlib::color_quad<unsigned_char,_int>_> *)0x28;
    uVar6 = 0;
    do {
      if (pcVar5->m_levels != 0) {
        uVar13 = 0;
        ppVar8 = ppVar7;
        do {
          uVar14 = pcVar5->m_width >> ((byte)uVar13 & 0x1f);
          uVar15 = uVar14 + (uVar14 == 0);
          uVar14 = pcVar5->m_height >> ((byte)uVar13 & 0x1f);
          uVar12 = uVar14 + (uVar14 == 0);
          pcVar1 = *(color_quad<unsigned_char,_int> **)
                    ((long)(pcVar5->m_pImages + -1) + 0x58 + uVar13 * 8 + (long)local_80);
          if (pcVar1 == (color_quad<unsigned_char,_int> *)0x0) {
            return false;
          }
          if (ppVar8->m_p != (color_quad<unsigned_char,_int> *)0x0) {
            crnlib_free(ppVar8->m_p);
            ppVar8->m_p = (color_quad<unsigned_char,_int> *)0x0;
            ppVar8->m_size = 0;
            ppVar8->m_capacity = 0;
            pcVar5 = this->m_pParams;
          }
          *(color_quad<unsigned_char,_int> **)((long)(ppVar8 + -1) + 8) = pcVar1;
          ((image_u8 *)(ppVar8 + -2))->m_width = uVar15;
          ((image_u8 *)(ppVar8 + -2))->m_height = uVar12;
          ((image_u8 *)(ppVar8 + -2))->m_pitch = uVar15;
          ((image_u8 *)(ppVar8 + -2))->m_total = uVar12 * uVar15;
          *(uint *)(ppVar8 + -1) = 0xf;
          uVar13 = uVar13 + 1;
          ppVar8 = ppVar8 + 3;
        } while (uVar13 < pcVar5->m_levels);
      }
      uVar6 = uVar6 + 1;
      local_80 = (image<crnlib::color_quad<unsigned_char,_int>_> *)((long)local_80 + 0x80);
      ppVar7 = ppVar7 + 0x30;
    } while (uVar6 < pcVar5->m_faces);
  }
  conv_type = image_utils::get_image_conversion_type_from_crn_format(pcVar5->m_format);
  pcVar5 = this->m_pParams;
  if ((conv_type != cConversion_Invalid) && (pcVar5->m_faces != 0)) {
    local_80 = this->m_images[0];
    uVar6 = 0;
    do {
      if (pcVar5->m_levels != 0) {
        uVar13 = 0;
        other = local_80;
        do {
          image<crnlib::color_quad<unsigned_char,_int>_>::image(&local_68,other);
          image_utils::convert_image(&local_68,conv_type);
          uVar3._0_4_ = other->m_width;
          uVar3._4_4_ = other->m_height;
          uVar4._0_4_ = other->m_pitch;
          uVar4._4_4_ = other->m_total;
          other->m_width = local_68.m_width;
          other->m_height = local_68.m_height;
          other->m_pitch = local_68.m_pitch;
          other->m_total = local_68.m_total;
          uVar12 = other->m_comp_flags;
          other->m_comp_flags = local_68.m_comp_flags;
          pcVar1 = other->m_pPixels;
          p = (other->m_pixel_buf).m_p;
          other->m_pPixels = local_68.m_pPixels;
          (other->m_pixel_buf).m_p = local_68.m_pixel_buf.m_p;
          uVar2._0_4_ = (other->m_pixel_buf).m_size;
          uVar2._4_4_ = (other->m_pixel_buf).m_capacity;
          (other->m_pixel_buf).m_size = local_68.m_pixel_buf.m_size;
          (other->m_pixel_buf).m_capacity = local_68.m_pixel_buf.m_capacity;
          local_68._0_8_ = uVar3;
          local_68._8_8_ = uVar4;
          local_68.m_comp_flags = uVar12;
          local_68.m_pPixels = pcVar1;
          local_68.m_pixel_buf.m_p = p;
          local_68.m_pixel_buf._8_8_ = uVar2;
          if (p != (color_quad<unsigned_char,_int> *)0x0) {
            crnlib_free(p);
          }
          uVar13 = uVar13 + 1;
          pcVar5 = this->m_pParams;
          other = other + 1;
        } while (uVar13 < pcVar5->m_levels);
      }
      uVar6 = uVar6 + 1;
      local_80 = local_80 + 0x10;
    } while (uVar6 < pcVar5->m_faces);
  }
  uVar14 = pcVar5->m_levels;
  uVar11 = (this->m_levels).m_size;
  if (uVar11 != uVar14) {
    if ((uVar11 <= uVar14) && ((this->m_levels).m_capacity < uVar14)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_levels,uVar14,uVar11 + 1 == uVar14,0xc,
                 (object_mover)0x0,false);
      pcVar5 = this->m_pParams;
    }
    (this->m_levels).m_size = uVar14;
  }
  this->m_total_blocks = 0;
  if (pcVar5->m_levels != 0) {
    plVar10 = (this->m_levels).m_p;
    lVar9 = 0;
    uVar6 = 0;
    do {
      uVar14 = pcVar5->m_height >> ((byte)uVar6 & 0x1f);
      uVar11 = pcVar5->m_width >> ((byte)uVar6 & 0x1f);
      *(uint *)((long)&plVar10->block_width + lVar9) =
           (uVar11 + 7 + (uint)(uVar11 == 0) & 0xfffffff8) >> (2U - this->m_has_subblocks & 0x1f);
      *(uint *)((long)&((this->m_levels).m_p)->first_block + lVar9) = this->m_total_blocks;
      plVar10 = (this->m_levels).m_p;
      *(uint *)((long)&plVar10->num_blocks + lVar9) =
           (uVar14 + 7 + (uint)(uVar14 == 0) >> 2 & 0xfffffffe) * this->m_pParams->m_faces *
           *(int *)((long)&plVar10->block_width + lVar9);
      plVar10 = (this->m_levels).m_p;
      this->m_total_blocks = this->m_total_blocks + *(int *)((long)&plVar10->num_blocks + lVar9);
      uVar6 = uVar6 + 1;
      pcVar5 = this->m_pParams;
      lVar9 = lVar9 + 0xc;
    } while (uVar6 < pcVar5->m_levels);
  }
  return true;
}

Assistant:

bool crn_comp::alias_images() {
  for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++) {
    for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++) {
      const uint width = math::maximum(1U, m_pParams->m_width >> level_index);
      const uint height = math::maximum(1U, m_pParams->m_height >> level_index);
      if (!m_pParams->m_pImages[face_index][level_index])
        return false;
      m_images[face_index][level_index].alias((color_quad_u8*)m_pParams->m_pImages[face_index][level_index], width, height);
    }
  }

  image_utils::conversion_type conv_type = image_utils::get_image_conversion_type_from_crn_format((crn_format)m_pParams->m_format);
  if (conv_type != image_utils::cConversion_Invalid) {
    for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++) {
      for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++) {
        image_u8 cooked_image(m_images[face_index][level_index]);
        image_utils::convert_image(cooked_image, conv_type);
        m_images[face_index][level_index].swap(cooked_image);
      }
    }
  }

  m_levels.resize(m_pParams->m_levels);
  m_total_blocks = 0;
  for (uint level = 0; level < m_pParams->m_levels; level++) {
    uint blockHeight = ((math::maximum(1U, m_pParams->m_height >> level) + 7) & ~7) >> 2;
    m_levels[level].block_width = ((math::maximum(1U, m_pParams->m_width >> level) + 7) & ~7) >> (m_has_subblocks ? 1 : 2);
    m_levels[level].first_block = m_total_blocks;
    m_levels[level].num_blocks = m_pParams->m_faces * m_levels[level].block_width * blockHeight;
    m_total_blocks += m_levels[level].num_blocks;
  }

  return true;
}